

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O0

exp_number
ising::free_energy::square::transfer_matrix<float>::product_U
          (uint_t Ly,real_t Jx,real_t beta,exp_number *factor,
          vector<float,_std::allocator<float>_> *v,vector<float,_std::allocator<float>_> *v_10,
          vector<float,_std::allocator<float>_> *v_20,vector<float,_std::allocator<float>_> *v_01,
          vector<float,_std::allocator<float>_> *v_02,vector<float,_std::allocator<float>_> *vt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  reference pdVar9;
  ulong uVar10;
  reference pvVar11;
  byte bVar12;
  vector<float,_std::allocator<float>_> *in_RCX;
  ulong in_RSI;
  exp_number in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  vector<float,_std::allocator<float>_> *in_R9;
  float in_XMM0_Da;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  float in_XMM1_Da;
  vector<float,_std::allocator<float>_> *in_stack_00000008;
  vector<float,_std::allocator<float>_> *in_stack_00000010;
  vector<float,_std::allocator<float>_> *in_stack_00000018;
  uint_t c_1;
  real_t norm_inv;
  uint_t c;
  real_t norm2;
  uint_t c1_4;
  uint_t c0_4;
  uint_t c1_3;
  uint_t c0_3;
  uint_t c1_2;
  uint_t c0_2;
  uint_t c1_1;
  uint_t c0_1;
  uint_t c1;
  uint_t c0;
  uint_t s;
  array<double,_2UL> weight;
  uint_t dim;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  float fVar18;
  float in_stack_fffffffffffffde4;
  float in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  ulong local_c8;
  ulong local_b8;
  float local_ac;
  ulong local_a0;
  ulong local_90;
  ulong local_80;
  ulong local_70;
  ulong local_60;
  ulong local_58;
  array<double,_2UL> local_50;
  ulong local_40;
  vector<float,_std::allocator<float>_> *local_38;
  vector<float,_std::allocator<float>_> *local_30;
  vector<float,_std::allocator<float>_> *local_28;
  float local_18;
  float local_14;
  ulong local_10;
  
  local_40 = (ulong)(1 << ((byte)in_RSI & 0x1f));
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  dVar16 = std::exp((double)(ulong)(uint)(in_XMM1_Da * in_XMM0_Da));
  pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
  *pdVar9 = (double)SUB84(dVar16,0);
  dVar16 = std::exp((double)(ulong)(uint)(-local_18 * local_14));
  pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
  *pdVar9 = (double)SUB84(dVar16,0);
  for (local_58 = 0; local_58 < local_10; local_58 = local_58 + 1) {
    for (local_60 = 0; bVar12 = (byte)local_58, local_60 < local_40; local_60 = local_60 + 1) {
      uVar10 = local_60 ^ (long)(1 << (bVar12 & 0x1f));
      fVar13 = local_14 * local_14;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar16 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_60);
      fVar15 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar5 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,uVar10);
      fVar18 = *pvVar11;
      fVar14 = local_14 * 2.0;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar6 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_30,local_60);
      fVar1 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar7 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_30,uVar10);
      fVar2 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar17 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_38,local_60);
      fVar3 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar8 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_38,uVar10);
      fVar4 = *pvVar11;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000018,local_60);
      *pvVar11 = (float)((double)fVar13 * (dVar16 * (double)fVar15 + dVar5 * (double)fVar18) +
                         (double)fVar14 * (dVar6 * (double)fVar1 + -(dVar7 * (double)fVar2)) +
                        dVar17 * (double)fVar3 + dVar8 * (double)fVar4);
    }
    std::swap<float,std::allocator<float>>
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    for (local_70 = 0; local_70 < local_40; local_70 = local_70 + 1) {
      uVar10 = local_70 ^ (long)(1 << (bVar12 & 0x1f));
      dVar17 = (double)local_14;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar16 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_70);
      fVar15 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar5 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,uVar10);
      fVar18 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar6 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_30,local_70);
      fVar1 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar7 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_30,uVar10);
      fVar2 = *pvVar11;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000018,local_70);
      *pvVar11 = (float)(dVar17 * (dVar16 * (double)fVar15 + -(dVar5 * (double)fVar18)) +
                        dVar6 * (double)fVar1 + dVar7 * (double)fVar2);
    }
    std::swap<float,std::allocator<float>>
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    for (local_80 = 0; local_80 < local_40; local_80 = local_80 + 1) {
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar16 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000010,local_80);
      fVar15 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar5 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          (in_stack_00000010,local_80 ^ (long)(1 << (bVar12 & 0x1f)));
      fVar18 = *pvVar11;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000018,local_80);
      *pvVar11 = (float)(dVar16 * (double)fVar15 + dVar5 * (double)fVar18);
    }
    std::swap<float,std::allocator<float>>
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    for (local_90 = 0; local_90 < local_40; local_90 = local_90 + 1) {
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar16 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000008,local_90);
      fVar15 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar5 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          (in_stack_00000008,local_90 ^ (long)(1 << (bVar12 & 0x1f)));
      fVar18 = *pvVar11;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000018,local_90);
      *pvVar11 = (float)(dVar16 * (double)fVar15 + dVar5 * (double)fVar18);
    }
    std::swap<float,std::allocator<float>>
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    for (local_a0 = 0; local_a0 < local_40; local_a0 = local_a0 + 1) {
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,0);
      dVar16 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_a0);
      fVar15 = *pvVar11;
      pdVar9 = boost::array<double,_2UL>::operator[](&local_50,1);
      dVar5 = *pdVar9;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          (local_28,local_a0 ^ (long)(1 << (bVar12 & 0x1f)));
      fVar18 = *pvVar11;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000018,local_a0);
      *pvVar11 = (float)(dVar16 * (double)fVar15 + dVar5 * (double)fVar18);
    }
    std::swap<float,std::allocator<float>>
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
  }
  local_ac = 0.0;
  for (local_b8 = 0; local_b8 < local_40; local_b8 = local_b8 + 1) {
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_b8);
    fVar15 = *pvVar11;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_b8);
    local_ac = fVar15 * *pvVar11 + local_ac;
  }
  dVar16 = std::sqrt((double)(ulong)(uint)local_ac);
  fVar15 = 1.0 / SUB84(dVar16,0);
  for (local_c8 = 0; local_c8 < local_40; local_c8 = local_c8 + 1) {
    fVar18 = fVar15;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_38,local_c8);
    *pvVar11 = fVar18 * *pvVar11;
    in_stack_fffffffffffffde4 = fVar15;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_30,local_c8);
    *pvVar11 = in_stack_fffffffffffffde4 * *pvVar11;
    in_stack_fffffffffffffde8 = fVar15;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000010,local_c8);
    *pvVar11 = in_stack_fffffffffffffde8 * *pvVar11;
    in_stack_fffffffffffffdec = fVar15;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](in_stack_00000008,local_c8);
    *pvVar11 = in_stack_fffffffffffffdec * *pvVar11;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_c8);
    *pvVar11 = fVar15 * *pvVar11;
  }
  standards::operator/
            ((exp_number<float> *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde4);
  return in_RDI;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }